

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_Writer::WriteFile(OSTEI_Writer *this)

{
  bool bVar1;
  ostream *poVar2;
  QAM *this_00;
  QAM am;
  string local_90;
  undefined1 local_70 [48];
  undefined1 local_40 [48];
  
  QAM::QAM((QAM *)local_40,
           &(((this->super_OSTEI_Writer_Base).info_)->super_GeneratorInfoBase).finalam_);
  Write_Full_(this);
  poVar2 = (this->super_OSTEI_Writer_Base).osh_;
  this_00 = (QAM *)local_40;
  QAM::QAM((QAM *)local_70,this_00);
  FunctionPrototype__abi_cxx11_(&local_90,(OSTEI_Writer *)this_00,(QAM *)local_70);
  poVar2 = std::operator<<(poVar2,(string *)&local_90);
  std::operator<<(poVar2,";\n\n");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)(local_70 + 0x10));
  bVar1 = GeneratorInfoBase::FinalPermute
                    (&((this->super_OSTEI_Writer_Base).info_)->super_GeneratorInfoBase);
  if (bVar1) {
    Write_Permutations_(this);
  }
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return;
}

Assistant:

void OSTEI_Writer::WriteFile(void) const
{
    const QAM am = info_.FinalAM();

    // is this a special permutation? Handle it if so.
    Write_Full_();

    // Add to the header
    osh_ << FunctionPrototype_(am) << ";\n\n";

    // Write out the code for permuting final integrals, if necessary
    if(info_.FinalPermute())
        Write_Permutations_();
}